

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapType
          (Maybe<capnp::Type> *__return_storage_ptr__,Node *this,Reader type,Schema scope)

{
  uint uVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  ErrorReporter *pEVar3;
  Node *params_1;
  anon_class_32_4_1d82241c *func;
  String local_3c0;
  ArrayPtr<const_char> local_3a8;
  Exception *local_390;
  Exception *exception;
  Maybe<capnp::Type> *local_378;
  Node *local_370;
  Reader *local_368;
  Node **local_360;
  Maybe<kj::Exception> local_358;
  undefined1 local_1c0 [8];
  NullableValue<kj::Exception> _exception986;
  Node *this_local;
  Schema scope_local;
  Maybe<capnp::Type> *result;
  
  _exception986.field_1._399_1_ = 0;
  this_local = (Node *)scope.raw;
  scope_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  kj::Maybe<capnp::Type>::Maybe(__return_storage_ptr__);
  local_360 = &this_local;
  params_1 = this;
  local_378 = __return_storage_ptr__;
  local_370 = this;
  local_368 = &type;
  kj::
  runCatchingExceptions<capnp::compiler::Compiler::Node::resolveBootstrapType(capnp::schema::Type::Reader,capnp::Schema)::__0>
            (&local_358,(kj *)&local_378,func);
  other = kj::_::readMaybe<kj::Exception>(&local_358);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_1c0,other);
  kj::Maybe<kj::Exception>::~Maybe(&local_358);
  pEVar2 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1c0);
  if (pEVar2 != (Exception *)0x0) {
    local_390 = kj::_::NullableValue<kj::Exception>::operator*
                          ((NullableValue<kj::Exception> *)local_1c0);
    kj::Maybe<capnp::Type>::operator=(__return_storage_ptr__);
    pEVar3 = CompiledModule::getErrorReporter(this->module);
    uVar1 = (*pEVar3->_vptr_ErrorReporter[1])();
    if ((uVar1 & 1) == 0) {
      kj::str<char_const(&)[57],kj::Exception&>
                (&local_3c0,(kj *)"Internal compiler bug: Bootstrap schema failed to load:\n",
                 (char (*) [57])local_390,(Exception *)params_1);
      kj::StringPtr::StringPtr((StringPtr *)&local_3a8,&local_3c0);
      addError(this,(StringPtr)local_3a8);
      kj::String::~String(&local_3c0);
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::Node::resolveBootstrapType(schema::Type::Reader type, Schema scope) {
  // TODO(someday): Arguably should return null if the type or its dependencies are placeholders.

  kj::Maybe<Type> result;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    result = module->getCompiler().getWorkspace().bootstrapLoader.getType(type, scope);
  })) {
    result = kj::none;
    if (!module->getErrorReporter().hadErrors()) {
      addError(kj::str("Internal compiler bug: Bootstrap schema failed to load:\n",
                       exception));
    }
  }
  return result;
}